

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak_internal.hpp
# Opt level: O0

adiak_datatype_t * adiak::internal::create_container_type<std::array<float,_3UL>_>::make_type(void)

{
  adiak_numerical_t aVar1;
  adiak_datatype_t **ppaVar2;
  adiak_datatype_t *paVar3;
  adiak_datatype_t *local_10;
  adiak_datatype_t *datatype;
  
  local_10 = (adiak_datatype_t *)malloc(0x20);
  memset(local_10,0,0x20);
  local_10->dtype = adiak_list;
  aVar1 = adiak_numerical_from_type(local_10->dtype);
  local_10->numerical = aVar1;
  local_10->num_elements = 0;
  local_10->num_subtypes = 1;
  ppaVar2 = (adiak_datatype_t **)malloc(8);
  local_10->subtype = ppaVar2;
  paVar3 = parse<float>::make_type();
  *local_10->subtype = paVar3;
  if (*local_10->subtype == (adiak_datatype_t *)0x0) {
    free(local_10);
    local_10 = (adiak_datatype_t *)0x0;
  }
  return local_10;
}

Assistant:

static adiak_datatype_t *make_type() {
            adiak_datatype_t *datatype = (adiak_datatype_t *) malloc(sizeof(adiak_datatype_t));
            memset(datatype, 0, sizeof(*datatype));
            datatype->dtype = element_type<T>::dtype;
            datatype->numerical = adiak_numerical_from_type(datatype->dtype);
            datatype->num_elements = 0;
            datatype->num_subtypes = 1;
            datatype->subtype = (adiak_datatype_t **) malloc(sizeof(adiak_datatype_t *));
            datatype->subtype[0] = parse<typename T::value_type>::make_type();
            if (datatype->subtype[0] == NULL) {
               free(datatype);
               datatype = NULL;
            }
            return datatype;
         }